

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SliceBase.h
# Opt level: O3

ValueLength __thiscall
arangodb::velocypack::SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::byteSize
          (SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *this,uint8_t *start)

{
  byte bVar1;
  uint uVar2;
  ValueLength VVar3;
  ulong uVar4;
  ulong uVar5;
  ulong extraout_RAX;
  Exception *this_00;
  byte bVar6;
  char cVar7;
  ulong uVar8;
  byte *pbVar9;
  byte *pbVar10;
  
  if ((ulong)"\x01\x01"[*start] != 0) {
    return (ulong)"\x01\x01"[*start];
  }
  bVar6 = *start;
  uVar4 = (ulong)bVar6;
  if (0xe < SliceStaticData::TypeMap[uVar4] - 4) goto switchD_0010ddaf_caseD_6;
  uVar2 = (uint)bVar6;
  switch((uint)SliceStaticData::TypeMap[uVar4]) {
  case 4:
  case 5:
    if ((byte)(bVar6 - 0x13) < 2) {
      pbVar9 = start + 1;
      VVar3 = 0;
      bVar6 = 0;
      do {
        bVar1 = *pbVar9;
        VVar3 = VVar3 + ((ulong)(bVar1 & 0x7f) << (bVar6 & 0x3f));
        bVar6 = bVar6 + 7;
        pbVar9 = pbVar9 + 1;
      } while ((char)bVar1 < '\0');
      return VVar3;
    }
    if (0x1f < bVar6) {
      SliceBase<arangodb::velocypack::Slice,arangodb::velocypack::Slice>::byteSizeDynamic();
      uVar4 = extraout_RAX;
      goto LAB_0010dff6;
    }
    switch(SliceStaticData::WidthMap[uVar4]) {
    case 1:
      return (ulong)start[1];
    case 2:
      return (ulong)*(ushort *)(start + 1);
    case 3:
      uVar5 = (ulong)start[1];
      uVar4 = (ulong)*(ushort *)(start + 2) << 8;
      goto LAB_0010dfe8;
    case 4:
      return (ulong)*(uint *)(start + 1);
    case 5:
      uVar2 = *(uint *)(start + 1);
      uVar4 = (ulong)start[5];
      break;
    case 6:
      uVar2 = *(uint *)(start + 1);
      uVar4 = (ulong)*(ushort *)(start + 5);
      break;
    case 7:
      uVar5 = (ulong)*(uint3 *)(start + 5) << 0x20;
      uVar4 = (ulong)*(uint *)(start + 1);
      goto LAB_0010dfe8;
    case 8:
      return *(ValueLength *)(start + 1);
    default:
      return 0;
    }
    uVar5 = (ulong)uVar2;
    uVar4 = uVar4 << 0x20;
LAB_0010dfe8:
    return uVar4 | uVar5;
  case 0xe:
    if (0xbe < bVar6) {
switchD_0010de31_caseD_fd:
      return *(long *)(start + 1) + 9;
    }
LAB_0010dff6:
    return uVar4 - 0x40;
  case 0xf:
    uVar4 = uVar4 - 0xbe;
    switch(uVar2) {
    case 0xc0:
      goto switchD_0010deec_caseD_c8;
    case 0xc1:
      goto switchD_0010deec_caseD_c9;
    case 0xc2:
      goto switchD_0010deec_caseD_ca;
    case 0xc3:
      goto switchD_0010deec_caseD_cb;
    case 0xc4:
      goto switchD_0010deec_caseD_cc;
    case 0xc5:
      goto switchD_0010deec_caseD_cd;
    case 0xc6:
      goto switchD_0010deec_caseD_ce;
    case 199:
      goto switchD_0010deec_caseD_cf;
    default:
      goto switchD_0010deec_default;
    }
  case 0x10:
    if (0xcf < bVar6) {
      uVar4 = (ulong)(uVar2 - 0xce);
      switch(uVar2) {
      case 0xd0:
        goto switchD_0010deec_caseD_c8;
      case 0xd1:
        goto switchD_0010deec_caseD_c9;
      case 0xd2:
        goto switchD_0010deec_caseD_ca;
      case 0xd3:
        goto switchD_0010deec_caseD_cb;
      case 0xd4:
        goto switchD_0010deec_caseD_cc;
      case 0xd5:
        goto switchD_0010deec_caseD_cd;
      case 0xd6:
        goto switchD_0010deec_caseD_ce;
      case 0xd7:
        goto switchD_0010deec_caseD_cf;
      default:
        goto switchD_0010deec_default;
      }
    }
    break;
  case 0x11:
    switch(uVar2) {
    case 0xf4:
    case 0xf5:
    case 0xf6:
      return (ulong)start[1] + 2;
    case 0xf7:
    case 0xf8:
    case 0xf9:
      return (ulong)*(ushort *)(start + 1) + 3;
    case 0xfa:
    case 0xfb:
    case 0xfc:
      return (ulong)*(uint *)(start + 1) + 5;
    case 0xfd:
    case 0xfe:
    case 0xff:
      goto switchD_0010de31_caseD_fd;
    }
  default:
switchD_0010ddaf_caseD_6:
    this_00 = (Exception *)__cxa_allocate_exception(0x18);
    Exception::Exception(this_00,InternalError,"Invalid type for byteSize()");
    __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
  case 0x12:
    if ((bVar6 & 0xfe) == 0xee) {
      bVar1 = 0;
      pbVar9 = start;
      do {
        pbVar10 = pbVar9 + 9;
        cVar7 = '\t';
        if (bVar6 == 0xee) {
          cVar7 = '\x02';
          pbVar10 = pbVar9 + 2;
        }
        bVar1 = bVar1 + cVar7;
        bVar6 = *pbVar10;
        pbVar9 = pbVar10;
      } while ((bVar6 & 0xfe) == 0xee);
      if (bVar1 != 0) {
        uVar5 = (ulong)bVar1;
        uVar4 = (ulong)"\x01\x01"[start[uVar5]];
        if (uVar4 == 0) {
          uVar4 = byteSizeDynamic(this,start + uVar5);
        }
        return uVar4 + uVar5;
      }
    }
    SliceBase<arangodb::velocypack::Slice,arangodb::velocypack::Slice>::byteSizeDynamic();
  }
  uVar4 = uVar4 - 0xc6;
  switch(uVar2) {
  case 200:
    goto switchD_0010deec_caseD_c8;
  case 0xc9:
switchD_0010deec_caseD_c9:
    uVar5 = (ulong)*(ushort *)(start + 1);
    goto LAB_0010df97;
  case 0xca:
switchD_0010deec_caseD_ca:
    uVar8 = (ulong)start[1];
    uVar5 = (ulong)*(ushort *)(start + 2) << 8;
    break;
  case 0xcb:
switchD_0010deec_caseD_cb:
    uVar5 = (ulong)*(uint *)(start + 1);
    goto LAB_0010df97;
  case 0xcc:
switchD_0010deec_caseD_cc:
    uVar2 = *(uint *)(start + 1);
    uVar5 = (ulong)start[5];
    goto LAB_0010df7a;
  case 0xcd:
switchD_0010deec_caseD_cd:
    uVar2 = *(uint *)(start + 1);
    uVar5 = (ulong)*(ushort *)(start + 5);
LAB_0010df7a:
    uVar8 = (ulong)uVar2;
    uVar5 = uVar5 << 0x20;
    break;
  case 0xce:
switchD_0010deec_caseD_ce:
    uVar8 = (ulong)*(uint3 *)(start + 5) << 0x20;
    uVar5 = (ulong)*(uint *)(start + 1);
    break;
  case 0xcf:
switchD_0010deec_caseD_cf:
    uVar5 = *(ulong *)(start + 1);
    goto LAB_0010df97;
  default:
switchD_0010deec_default:
    uVar5 = 0;
    goto LAB_0010df97;
  }
  uVar5 = uVar5 | uVar8;
LAB_0010df97:
  return uVar5 + uVar4;
switchD_0010deec_caseD_c8:
  uVar5 = (ulong)start[1];
  goto LAB_0010df97;
}

Assistant:

ValueLength byteSize(uint8_t const* start) const {
    // check if the type has a fixed length first
    ValueLength l =
        static_cast<ValueLength>(SliceStaticData::FixedTypeLengths[*start]);
    if (l != 0) {
      // return fixed length
      return l;
    }
    return byteSizeDynamic(start);
  }